

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderTessellationInputPatchDiscard::initTest
          (TessellationShaderTessellationInputPatchDiscard *this)

{
  GLuint *pGVar1;
  int iVar2;
  GLenum GVar3;
  GLuint GVar4;
  undefined4 extraout_var;
  TessellationShaderUtils *this_00;
  NotSupportedError *this_01;
  long lVar5;
  char *fs_body;
  string local_68;
  undefined8 local_40;
  char *vs_body;
  Functions *gl;
  
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported != false) {
    iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    gl = (Functions *)CONCAT44(extraout_var,iVar2);
    this_00 = (TessellationShaderUtils *)operator_new(0x20);
    TessellationShaderUtils::TessellationShaderUtils(this_00,gl,&this->super_TestCaseBase);
    this->m_utils_ptr = this_00;
    (*gl->genVertexArrays)(1,&this->m_vao_id);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"Could not generate vertex array object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x1cb);
    (*gl->bindVertexArray)(this->m_vao_id);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"Error binding vertex array object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x1ce);
    pGVar1 = &this->m_bo_id;
    (*gl->genBuffers)(1,pGVar1);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"glGenBuffers() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x1d1);
    GVar4 = (*gl->createShader)(0x8b30);
    this->m_fs_id = GVar4;
    GVar4 = (*gl->createShader)(0x8b31);
    this->m_vs_id = GVar4;
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"glCreateShader() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x1d5);
    fs_body = "${VERSION}\n\nvoid main()\n{\n}\n";
    TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,this->m_fs_id,1,&fs_body);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"glShaderSource() failed for fragment shader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x1df);
    vs_body = "${VERSION}\n\nvoid main()\n{\n    gl_Position = vec4(1.0, 0.0, 0.0, 1.0);\n}\n";
    TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,this->m_vs_id,1,&vs_body);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"glShaderSource() failed for vertex shader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x1ea);
    local_40._0_4_ = this->m_fs_id;
    local_40._4_4_ = this->m_vs_id;
    TessellationShaderUtils::compileShaders(this->m_utils_ptr,2,(GLuint *)&local_40,true);
    for (lVar5 = 0; lVar5 != 0xc; lVar5 = lVar5 + 4) {
      local_68._M_dataplus._M_p = (pointer)0x300000000;
      local_68._M_string_length = 0;
      initRun(this,(_run *)&local_68,*(_tessellation_primitive_mode *)((long)&DAT_017b9170 + lVar5))
      ;
      std::
      vector<glcts::TessellationShaderTessellationInputPatchDiscard::_run,_std::allocator<glcts::TessellationShaderTessellationInputPatchDiscard::_run>_>
      ::push_back(&this->m_runs,(value_type *)&local_68);
    }
    (*gl->bindBuffer)(0x8c8e,*pGVar1);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"glBindBuffer() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x208);
    (*gl->bindBufferBase)(0x8c8e,0,*pGVar1);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"glBindBufferBase() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x20b);
    return;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"Tessellation shader functionality not supported, skipping",
             (allocator<char> *)&fs_body);
  tcu::NotSupportedError::NotSupportedError(this_01,&local_68);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TessellationShaderTessellationInputPatchDiscard::initTest()
{
	/* Skip if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Generate all test-wide objects needed for test execution */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();
	m_utils_ptr				 = new TessellationShaderUtils(gl, this);

	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed");

	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() failed");

	/* Configure fragment shader body */
	const char* fs_body = "${VERSION}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "}\n";

	shaderSourceSpecialized(m_fs_id, 1 /* count */, &fs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for fragment shader");

	/* Configure vertex shader body */
	const char* vs_body = "${VERSION}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    gl_Position = vec4(1.0, 0.0, 0.0, 1.0);\n"
						  "}\n";

	shaderSourceSpecialized(m_vs_id, 1 /* count */, &vs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for vertex shader");

	/* Compile all the shaders */
	const glw::GLuint  shaders[] = { m_fs_id, m_vs_id };
	const unsigned int n_shaders = sizeof(shaders) / sizeof(shaders[0]);

	m_utils_ptr->compileShaders(n_shaders, shaders, true);

	/* Initialize all the runs. */
	const _tessellation_primitive_mode primitive_modes[] = { TESSELLATION_SHADER_PRIMITIVE_MODE_ISOLINES,
															 TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS,
															 TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES };
	const unsigned int n_primitive_modes = sizeof(primitive_modes) / sizeof(primitive_modes[0]);

	for (unsigned int n_primitive_mode = 0; n_primitive_mode < n_primitive_modes; ++n_primitive_mode)
	{
		/* Initialize the run */
		_tessellation_primitive_mode primitive_mode = primitive_modes[n_primitive_mode];
		_run						 run;

		initRun(run, primitive_mode);

		/* Store the run */
		m_runs.push_back(run);
	} /* for (all primitive modes) */

	/* Set up buffer object bindings. Storage size will be determined on
	 * a per-iteration basis.
	 **/
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() failed");
}